

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format_filename(string *t_fname)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  string *in_RDI;
  stringstream ss;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  bVar1 = std::operator!=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar1) {
    poVar2 = std::operator<<(local_188,"in \'");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,"\' ");
  }
  else {
    std::operator<<(local_188,"during evaluation ");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string format_filename(const std::string &t_fname)
      {
        std::stringstream ss;

        if (t_fname != "__EVAL__")
        {
          ss << "in '" << t_fname << "' ";
        } else {
          ss << "during evaluation ";
        }

        return ss.str();
      }